

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualIterator.hpp
# Opt level: O0

VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>
Lib::VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>::getEmpty(void)

{
  int iVar1;
  IteratorCore<Indexing::TermWithValue<Kernel::Literal_*>_*> *core;
  IteratorCore<Indexing::TermWithValue<Kernel::Literal_*>_*> *in_RDI;
  
  if (VirtualIterator<Indexing::TermWithValue<Kernel::Literal*>*>::getEmpty()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&VirtualIterator<Indexing::TermWithValue<Kernel::Literal*>*>::
                                 getEmpty()::inst);
    if (iVar1 != 0) {
      core = (IteratorCore<Indexing::TermWithValue<Kernel::Literal_*>_*> *)
             EmptyIterator<Indexing::TermWithValue<Kernel::Literal*>*>::operator_new(0x58b08a);
      EmptyIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>::EmptyIterator
                ((EmptyIterator<Indexing::TermWithValue<Kernel::Literal_*>_*> *)core);
      VirtualIterator(&getEmpty::inst,core);
      __cxa_atexit(~VirtualIterator,&getEmpty::inst,&__dso_handle);
      __cxa_guard_release(&VirtualIterator<Indexing::TermWithValue<Kernel::Literal*>*>::getEmpty()::
                           inst);
    }
  }
  VirtualIterator((VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*> *)in_RDI,
                  &getEmpty::inst);
  return (VirtualIterator<Indexing::TermWithValue<Kernel::Literal_*>_*>)in_RDI;
}

Assistant:

static VirtualIterator getEmpty()
  {
    static VirtualIterator inst(new EmptyIterator<T>());
    return inst;
  }